

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O3

void lj_err_throw(lua_State *L,int errcode)

{
  uint *puVar1;
  uint64_t uVar2;
  code *pcVar3;
  long *in_FS_OFFSET;
  
  uVar2 = (L->glref).ptr64;
  puVar1 = (uint *)(uVar2 + 0x3cc);
  *puVar1 = *puVar1 & 0xffffffef;
  L->status = '\0';
  in_FS_OFFSET[-6] = 0;
  in_FS_OFFSET[-5] = 0;
  in_FS_OFFSET[-2] = 0;
  in_FS_OFFSET[-1] = 0;
  in_FS_OFFSET[-4] = 0;
  in_FS_OFFSET[-3] = 0;
  in_FS_OFFSET[-6] = (long)errcode | 0x4c55414a49543200;
  in_FS_OFFSET[-2] = uVar2;
  _Unwind_RaiseException(*in_FS_OFFSET + -0x30);
  pcVar3 = *(code **)((L->glref).ptr64 + 0x160);
  if (pcVar3 != (code *)0x0) {
    (*pcVar3)(L);
  }
  exit(1);
}

Assistant:

LJ_FASTCALL lj_err_throw(lua_State *L, int errcode)
{
  global_State *g = G(L);
  lj_trace_abort(g);
  L->status = LUA_OK;
#if LJ_UNWIND_EXT
  err_raise_ext(g, errcode);
  /*
  ** A return from this function signals a corrupt C stack that cannot be
  ** unwound. We have no choice but to call the panic function and exit.
  **
  ** Usually this is caused by a C function without unwind information.
  ** This may happen if you've manually enabled LUAJIT_UNWIND_EXTERNAL
  ** and forgot to recompile *every* non-C++ file with -funwind-tables.
  */
  if (G(L)->panic)
    G(L)->panic(L);
#else
#if LJ_HASJIT
  g->saved_jit_base = g->jit_base;
  setmref(g->jit_base, NULL);
#endif
  {
    void *cf = err_unwind(L, NULL, errcode);
    if (cframe_unwind_ff(cf))
      lj_vm_unwind_ff(cframe_raw(cf));
    else
      lj_vm_unwind_c(cframe_raw(cf), errcode);
  }
#endif
  exit(EXIT_FAILURE);
}